

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.h
# Opt level: O0

QString * __thiscall
MakefileGenerator::escapeFilePath<ProString&,ProString>
          (MakefileGenerator *this,QStringBuilder<ProString_&,_ProString> *path)

{
  long *in_RSI;
  QStringBuilder<ProString_&,_ProString> *in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<ProString_&,_ProString> *pQVar1;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = in_RDI;
  ::QStringBuilder::operator_cast_to_QString(in_RDI);
  (**(code **)(*in_RSI + 0x60))(in_RDI,in_RSI,local_20);
  QString::~QString((QString *)0x21d551);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)pQVar1;
  }
  __stack_chk_fail();
}

Assistant:

QString escapeFilePath(const QStringBuilder<A, B> &path) const
    { return escapeFilePath(QString(path)); }